

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall
despot::TagBlindBeliefPolicy::TagBlindBeliefPolicy(TagBlindBeliefPolicy *this,BaseTag *model)

{
  DSPOMDP *local_30;
  BaseTag *model_local;
  TagBlindBeliefPolicy *this_local;
  
  local_30 = (DSPOMDP *)0x0;
  if (model != (BaseTag *)0x0) {
    local_30 = (DSPOMDP *)&model->super_BeliefMDP;
  }
  despot::BeliefLowerBound::BeliefLowerBound(&this->super_BeliefLowerBound,local_30);
  *(undefined ***)this = &PTR__TagBlindBeliefPolicy_00159928;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->alpha_vectors_);
  this->tag_model_ = model;
  (**(code **)(*(long *)this->tag_model_ + 0x38))();
  return;
}

Assistant:

TagBlindBeliefPolicy(const BaseTag* model) :
		BeliefLowerBound(model),
		tag_model_(model) {
		const_cast<BaseTag*>(tag_model_)->ComputeBlindAlpha();
	}